

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

bool check_mist(CHAR_DATA *ch,CHAR_DATA *victim,int dt)

{
  bool bVar1;
  short sVar2;
  int iVar3;
  char *arg2;
  CHAR_DATA *in_RSI;
  char *attack;
  float chance;
  char buf2 [4608];
  char buf1 [4608];
  CHAR_DATA *in_stack_ffffffffffffdbc8;
  int dt_00;
  undefined4 in_stack_ffffffffffffdbd0;
  float fVar4;
  CHAR_DATA *in_stack_ffffffffffffdbd8;
  char *in_stack_ffffffffffffdbe0;
  char local_1228 [4647];
  bool local_1;
  
  fVar4 = 50.0;
  bVar1 = is_awake(in_RSI);
  if (bVar1) {
    sVar2 = get_hitroll(in_stack_ffffffffffffdbc8);
    dt_00 = (int)((ulong)in_stack_ffffffffffffdbc8 >> 0x20);
    fVar4 = (1.0 - (float)(int)sVar2 / 250.0) * fVar4;
    iVar3 = number_percent();
    if ((float)iVar3 <= fVar4) {
      arg2 = get_dam_message((CHAR_DATA *)CONCAT44(fVar4,in_stack_ffffffffffffdbd0),dt_00);
      sprintf(local_1228,"$n\'s %s passes harmlessly through your cloak of mist.",arg2);
      sprintf(&stack0xffffffffffffdbd8,"Your %s passes harmlessly through $N\'s cloak of mist.",arg2
             );
      act(in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbd8,
          (void *)CONCAT44(fVar4,in_stack_ffffffffffffdbd0),arg2,0);
      act(in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbd8,
          (void *)CONCAT44(fVar4,in_stack_ffffffffffffdbd0),arg2,0);
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool check_mist(CHAR_DATA *ch, CHAR_DATA *victim, int dt)
{
	char buf1[MSL], buf2[MSL];
	float chance = 50;
	char *attack;

	if (!is_awake(victim))
		return false;

	chance *= (float)((float)1 - (float)((float)get_hitroll(ch) / (float)250));

	if (number_percent() > chance)
		return false;

	attack = get_dam_message(ch, dt);

	sprintf(buf1, "$n's %s passes harmlessly through your cloak of mist.", attack);
	sprintf(buf2, "Your %s passes harmlessly through $N's cloak of mist.", attack);

	act(buf1, ch, 0, victim, TO_VICT);
	act(buf2, ch, 0, victim, TO_CHAR);
	return true;
}